

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::SetupLegacyScriptPubKeyMan(CWallet *this)

{
  bool bVar1;
  mapped_type *ppSVar2;
  long *plVar3;
  mapped_type pSVar4;
  long in_FS_OFFSET;
  uint256 id;
  mapped_type local_70;
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_38;
  
  local_38._M_i.__d.__r =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )((duration *)(in_FS_OFFSET + 0x28))->__r;
  if ((((this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
      ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
       (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
     (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0)) {
    (*((this->m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase
      [0xd])(&local_58);
    bVar1 = std::operator==(&local_58,"bdb_ro");
    if (bVar1) {
      std::make_unique<wallet::LegacyDataSPKM,wallet::CWallet&>((CWallet *)(local_68 + 8));
      pSVar4 = (mapped_type)local_68._8_8_;
    }
    else {
      std::make_unique<wallet::LegacyScriptPubKeyMan,wallet::CWallet&,long&>
                ((CWallet *)local_68,(long *)this);
      pSVar4 = (mapped_type)local_68._0_8_;
    }
    local_68._8_8_ = (mapped_type)0x0;
    std::__cxx11::string::~string((string *)&local_58);
    plVar3 = (long *)(wallet::LEGACY_OUTPUT_TYPES + 0x10);
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
      ppSVar2 = std::
                map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                ::operator[](&this->m_internal_spk_managers,(key_type *)(plVar3 + 1));
      *ppSVar2 = pSVar4;
      ppSVar2 = std::
                map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                ::operator[](&this->m_external_spk_managers,(key_type *)(plVar3 + 1));
      *ppSVar2 = pSVar4;
    }
    (*pSVar4->_vptr_ScriptPubKeyMan[0x1a])(&local_58,pSVar4);
    local_70 = pSVar4;
    AddScriptPubKeyMan(this,(uint256 *)&local_58,
                       (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                        )&local_70);
    if (local_70 != (mapped_type)0x0) {
      (*local_70->_vptr_ScriptPubKeyMan[1])();
    }
  }
  if ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
       )((duration *)(in_FS_OFFSET + 0x28))->__r == local_38._M_i.__d.__r) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SetupLegacyScriptPubKeyMan()
{
    if (!m_internal_spk_managers.empty() || !m_external_spk_managers.empty() || !m_spk_managers.empty() || IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        return;
    }

    std::unique_ptr<ScriptPubKeyMan> spk_manager = m_database->Format() == "bdb_ro" ?
        std::make_unique<LegacyDataSPKM>(*this) :
        std::make_unique<LegacyScriptPubKeyMan>(*this, m_keypool_size);

    for (const auto& type : LEGACY_OUTPUT_TYPES) {
        m_internal_spk_managers[type] = spk_manager.get();
        m_external_spk_managers[type] = spk_manager.get();
    }
    uint256 id = spk_manager->GetID();
    AddScriptPubKeyMan(id, std::move(spk_manager));
}